

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_math.cpp
# Opt level: O1

double getCorrelationCoefficient3d(TRIPLERGB **mrx,int h,int w,int component,int y,int x)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int j;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined8 local_78;
  
  if (y < 0) {
    local_78 = getExpection(mrx,h,w - x,component,-y,0);
    iVar5 = y + h;
    iVar4 = 0;
  }
  else {
    local_78 = getExpection(mrx,h - y,w - x,component,0,0);
    iVar5 = h;
    iVar4 = y;
  }
  dVar6 = getExpection(mrx,iVar5,w,component,iVar4,x);
  uVar3 = -y;
  if (0 < y) {
    uVar3 = y;
  }
  dVar7 = 0.0;
  dVar9 = 0.0;
  dVar11 = 0.0;
  if ((int)uVar3 < h) {
    iVar4 = 0;
    iVar5 = y;
    if (y < 1) {
      iVar5 = iVar4;
    }
    do {
      if (0 < w - x) {
        j = 0;
        do {
          bVar1 = getComponent((TRIPLEBYTES **)mrx,(y >> 0x1f & uVar3) + iVar4,j,component);
          bVar2 = getComponent((TRIPLEBYTES **)mrx,iVar5 + iVar4,x + j,component);
          dVar10 = (double)bVar2 - dVar6;
          dVar8 = (double)bVar1 - local_78;
          dVar9 = dVar9 + dVar8 * dVar10;
          dVar11 = dVar11 + dVar8 * dVar8;
          dVar7 = dVar7 + dVar10 * dVar10;
          j = j + 1;
        } while (w - x != j);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != h - uVar3);
    dVar11 = dVar11 * dVar7;
  }
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  return dVar9 / dVar11;
}

Assistant:

double getCorrelationCoefficient3d(TRIPLERGB **mrx, int h, int w, int component, int y, int x) {
    double Exp1;
    double Exp2;
    if (y < 0) {
        Exp1 = getExpection(mrx, h, w - x, component, abs(y), 0);
        Exp2 = getExpection(mrx, h - abs(y), w, component, 0, x);
    } else {
        Exp1 = getExpection(mrx, h - y, w - x, component);
        Exp2 = getExpection(mrx, h, w, component, y, x);
    }
    double count = 0;
    double count1 = 0;
    double count2 = 0;
    double countSqr1 = 0;
    double countSqr2 = 0;
    for (int i = 0; i < h - abs(y); i++) {
        for (int j = 0; j < w - x; j++) {
            if (y < 0) {
                count1 = (double) getComponent((TRIPLEBYTES **) mrx, abs(y) + i, j, component) - Exp1;
                count2 = (double) getComponent((TRIPLEBYTES **) mrx, i, x + j, component) - Exp2;
            } else {
                count1 = (double) getComponent((TRIPLEBYTES **) mrx, i, j, component) - Exp1;
                count2 = (double) getComponent((TRIPLEBYTES **) mrx, y + i, x + j, component) - Exp2;
            }
            count += count1 * count2;
            countSqr1 += pow(count1, 2);
            countSqr2 += pow(count2, 2);
        }
    }
    return count / sqrt(countSqr1 * countSqr2);
}